

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O3

int32 hmm_vit_eval_anytopo(hmm_t *hmm)

{
  uint8 uVar1;
  hmm_context_t *phVar2;
  int *piVar3;
  bool bVar4;
  hmm_state_t *phVar5;
  hmm_state_t *phVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int32 iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  
  phVar2 = hmm->ctx;
  uVar1 = hmm->mpx;
  if (uVar1 == '\0') {
    iVar13 = (hmm->s).ssid;
  }
  else {
    iVar13 = *(hmm->s).mpx_ssid;
  }
  if (iVar13 == -1) {
    iVar13 = -0x38000000;
  }
  else {
    iVar13 = phVar2->senscore[*phVar2->sseq[iVar13]];
  }
  piVar3 = phVar2->st_sen_scr;
  *piVar3 = iVar13 + hmm->state[0].score;
  uVar11 = (ulong)hmm->n_emit_state;
  if (1 < hmm->n_emit_state) {
    phVar5 = hmm->state;
    uVar10 = 1;
    do {
      phVar5 = phVar5 + 1;
      if (uVar1 == '\0') {
        iVar12 = (hmm->s).ssid;
      }
      else {
        iVar12 = (hmm->s).mpx_ssid[uVar10];
      }
      if (iVar12 == -1) {
        iVar12 = -0x38000000;
      }
      else {
        iVar12 = phVar2->senscore[phVar2->sseq[iVar12][uVar10]];
      }
      iVar13 = iVar12 + phVar5->score;
      if (iVar13 < -0x37ffffff) {
        iVar13 = -0x38000000;
      }
      piVar3[uVar10] = iVar13;
      uVar10 = uVar10 + 1;
      uVar11 = (ulong)hmm->n_emit_state;
    } while (uVar10 < uVar11);
  }
  if ((char)uVar11 == '\0') {
    (hmm->out).score = -0x38000000;
    iVar13 = -0x38000000;
  }
  else {
    phVar5 = hmm->state;
    uVar14 = (int)uVar11 - 1;
    uVar10 = (ulong)uVar14;
    uVar7 = 0xffffffff;
    iVar13 = -0x38000000;
    lVar16 = uVar10 + 1;
    do {
      if ((-0x38000000 < phVar2->tp[hmm->tmatid][lVar16 + -1][uVar11]) &&
         (iVar8 = phVar2->tp[hmm->tmatid][lVar16 + -1][uVar11] + piVar3[lVar16 + -1], iVar13 < iVar8
         )) {
        uVar7 = (ulong)uVar14;
        iVar13 = iVar8;
      }
      uVar14 = uVar14 - 1;
      lVar17 = lVar16 + -1;
      bVar4 = 0 < lVar16;
      lVar16 = lVar17;
    } while (lVar17 != 0 && bVar4);
    (hmm->out).score = iVar13;
    if (-1 < (int)uVar7) {
      (hmm->out).history = hmm->state[uVar7].history;
    }
    uVar7 = uVar10;
    if ((int)uVar11 != 0) {
      do {
        iVar8 = phVar2->tp[hmm->tmatid][uVar10][uVar10];
        iVar9 = -0x38000000;
        if (-0x38000000 < iVar8) {
          iVar9 = iVar8 + phVar2->st_sen_scr[uVar10];
        }
        if ((long)uVar10 < 1) {
          phVar6 = phVar5 + uVar10;
          if (uVar10 == 0) {
            phVar6 = phVar5;
          }
          phVar6->score = iVar9;
          if (iVar13 <= iVar9) {
            iVar13 = iVar9;
          }
          break;
        }
        uVar14 = 0xffffffff;
        iVar8 = (int)uVar11;
        uVar18 = uVar7 - 1;
        do {
          iVar15 = phVar2->tp[hmm->tmatid][uVar18 & 0xffffffff][uVar10];
          if (-0x38000000 < iVar15) {
            iVar15 = iVar15 + phVar2->st_sen_scr[uVar18 & 0xffffffff];
            if (iVar9 < iVar15) {
              iVar9 = iVar15;
              uVar14 = (int)uVar11 - 2;
            }
          }
          uVar19 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar19;
          uVar18 = uVar18 - 1;
        } while (1 < (int)uVar19);
        phVar5[uVar10].score = iVar9;
        if (-1 < (int)uVar14) {
          phVar5[uVar10].history = hmm->state[uVar14].history;
          if (uVar1 != '\0') {
            (hmm->s).mpx_ssid[uVar10] = (hmm->s).mpx_ssid[uVar14];
          }
        }
        if (iVar13 <= iVar9) {
          iVar13 = iVar9;
        }
        uVar11 = (ulong)(iVar8 - 1);
        bVar4 = 0 < (long)uVar10;
        uVar10 = uVar10 - 1;
        uVar7 = uVar7 - 1;
      } while (bVar4);
    }
  }
  hmm->bestscore = iVar13;
  return iVar13;
}

Assistant:

static int32
hmm_vit_eval_anytopo(hmm_t * hmm)
{
    hmm_context_t *ctx = hmm->ctx;
    int32 to, from, bestfrom;
    int32 newscr, scr, bestscr;
    int final_state;

    /* Compute previous state-score + observation output prob for each emitting state */
    ctx->st_sen_scr[0] = hmm_in_score(hmm) + hmm_senscr(hmm, 0);
    for (from = 1; from < hmm_n_emit_state(hmm); ++from) {
        if ((ctx->st_sen_scr[from] =
             hmm_score(hmm, from) + hmm_senscr(hmm, from)) < WORST_SCORE)
            ctx->st_sen_scr[from] = WORST_SCORE;
    }

    /* FIXME/TODO: Use the BLAS for all this. */
    /* Evaluate final-state first, which does not have a self-transition */
    final_state = hmm_n_emit_state(hmm);
    to = final_state;
    scr = WORST_SCORE;
    bestfrom = -1;
    for (from = to - 1; from >= 0; --from) {
        if ((hmm_tprob(hmm, from, to) > WORST_SCORE) &&
            ((newscr = ctx->st_sen_scr[from]
              + hmm_tprob(hmm, from, to)) > scr)) {
            scr = newscr;
            bestfrom = from;
        }
    }
    hmm_out_score(hmm) = scr;
    if (bestfrom >= 0)
        hmm_out_history(hmm) = hmm_history(hmm, bestfrom);
    bestscr = scr;

    /* Evaluate all other states, which might have self-transitions */
    for (to = final_state - 1; to >= 0; --to) {
        /* Score from self-transition, if any */
        scr =
            (hmm_tprob(hmm, to, to) > WORST_SCORE)
            ? ctx->st_sen_scr[to] + hmm_tprob(hmm, to, to)
            : WORST_SCORE;

        /* Scores from transitions from other states */
        bestfrom = -1;
        for (from = to - 1; from >= 0; --from) {
            if ((hmm_tprob(hmm, from, to) > WORST_SCORE) &&
                ((newscr = ctx->st_sen_scr[from]
                  + hmm_tprob(hmm, from, to)) > scr)) {
                scr = newscr;
                bestfrom = from;
            }
        }

        /* Update new result for state to */
        if (to == 0) {
            hmm_in_score(hmm) = scr;
            if (bestfrom >= 0)
                hmm_in_history(hmm) = hmm_history(hmm, bestfrom);
        }
        else {
            hmm_score(hmm, to) = scr;
            if (bestfrom >= 0)
                hmm_history(hmm, to) = hmm_history(hmm, bestfrom);
        }
        if (bestfrom >= 0 && hmm_is_mpx(hmm))
            hmm->s.mpx_ssid[to] = hmm->s.mpx_ssid[bestfrom];

        if (bestscr < scr)
            bestscr = scr;
    }

    hmm_bestscore(hmm) = bestscr;
    return bestscr;
}